

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

void createSimpleNeuralNetworkClassifierModel(Model *spec,char *inputName,char *outputName)

{
  RepeatedField<long> *pRVar1;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  RepeatedField<float> *pRVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Rep *pRVar6;
  ConvolutionLayerParams *pCVar7;
  long lVar8;
  long lVar9;
  ModelDescription *pMVar10;
  FeatureType *pFVar11;
  ArrayFeatureType *pAVar12;
  long *plVar13;
  StringFeatureType *pSVar14;
  FeatureDescription *pFVar15;
  DictionaryFeatureType *pDVar16;
  NeuralNetworkClassifier *pNVar17;
  StringVector *pSVar18;
  InnerProductLayerParams *pIVar19;
  WeightParams *pWVar20;
  float *pfVar21;
  NeuralNetworkLayer *pNVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  void *pvVar24;
  undefined8 *puVar25;
  int iVar26;
  Arena *pAVar27;
  string featureName;
  string probsName;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  spec->specificationversion_ = 9;
  if (spec->description_ == (ModelDescription *)0x0) {
    uVar5 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pMVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar27);
    spec->description_ = pMVar10;
  }
  pMVar10 = spec->description_;
  pRVar6 = (pMVar10->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_00203623:
    pFVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar10->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar24 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar10->input_).super_RepeatedPtrFieldBase,pFVar15);
  }
  else {
    iVar26 = (pMVar10->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar26) goto LAB_00203623;
    (pMVar10->input_).super_RepeatedPtrFieldBase.current_size_ = iVar26 + 1;
    pvVar24 = pRVar6->elements[iVar26];
  }
  puVar25 = (undefined8 *)(*(ulong *)((long)pvVar24 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar24 + 8) & 1) != 0) {
    puVar25 = (undefined8 *)*puVar25;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar24 + 0x10),inputName,puVar25);
  if (*(long *)((long)pvVar24 + 0x20) == 0) {
    pAVar27 = (Arena *)(*(ulong *)((long)pvVar24 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar24 + 8) & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                        (pAVar27);
    *(FeatureType **)((long)pvVar24 + 0x20) = pFVar11;
  }
  pFVar11 = *(FeatureType **)((long)pvVar24 + 0x20);
  if (pFVar11->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar11);
    pFVar11->_oneof_case_[0] = 5;
    uVar5 = (pFVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pAVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar27);
    (pFVar11->Type_).multiarraytype_ = pAVar12;
  }
  pAVar12 = (pFVar11->Type_).multiarraytype_;
  pRVar1 = &pAVar12->shape_;
  uVar3 = (pAVar12->shape_).current_size_;
  uVar4 = (pAVar12->shape_).total_size_;
  if (uVar3 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar13 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar13[uVar3] = 3;
  pRVar1->current_size_ = uVar3 + 1;
  if (*(long *)((long)pvVar24 + 0x20) == 0) {
    pAVar27 = (Arena *)(*(ulong *)((long)pvVar24 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar24 + 8) & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                        (pAVar27);
    *(FeatureType **)((long)pvVar24 + 0x20) = pFVar11;
  }
  pFVar11 = *(FeatureType **)((long)pvVar24 + 0x20);
  if (pFVar11->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar11);
    pFVar11->_oneof_case_[0] = 5;
    uVar5 = (pFVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pAVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar27);
    (pFVar11->Type_).multiarraytype_ = pAVar12;
  }
  ((pFVar11->Type_).multiarraytype_)->datatype_ = 0x20020;
  if (spec->description_ == (ModelDescription *)0x0) {
    uVar5 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pMVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar27);
    spec->description_ = pMVar10;
  }
  pMVar10 = spec->description_;
  pRVar6 = (pMVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_002037a7:
    pFVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar10->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar24 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar10->output_).super_RepeatedPtrFieldBase,pFVar15);
  }
  else {
    iVar26 = (pMVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar26) goto LAB_002037a7;
    (pMVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar26 + 1;
    pvVar24 = pRVar6->elements[iVar26];
  }
  puVar25 = (undefined8 *)(*(ulong *)((long)pvVar24 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar24 + 8) & 1) != 0) {
    puVar25 = (undefined8 *)*puVar25;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar24 + 0x10),outputName,puVar25);
  if (*(long *)((long)pvVar24 + 0x20) == 0) {
    pAVar27 = (Arena *)(*(ulong *)((long)pvVar24 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar24 + 8) & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                        (pAVar27);
    *(FeatureType **)((long)pvVar24 + 0x20) = pFVar11;
  }
  pFVar11 = *(FeatureType **)((long)pvVar24 + 0x20);
  if (pFVar11->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar11);
    pFVar11->_oneof_case_[0] = 5;
    uVar5 = (pFVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pAVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar27);
    (pFVar11->Type_).multiarraytype_ = pAVar12;
  }
  pAVar12 = (pFVar11->Type_).multiarraytype_;
  pRVar1 = &pAVar12->shape_;
  uVar3 = (pAVar12->shape_).current_size_;
  uVar4 = (pAVar12->shape_).total_size_;
  if (uVar3 == uVar4) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar4 + 1);
  }
  plVar13 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar13[uVar3] = 3;
  pRVar1->current_size_ = uVar3 + 1;
  if (*(long *)((long)pvVar24 + 0x20) == 0) {
    pAVar27 = (Arena *)(*(ulong *)((long)pvVar24 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar24 + 8) & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                        (pAVar27);
    *(FeatureType **)((long)pvVar24 + 0x20) = pFVar11;
  }
  pFVar11 = *(FeatureType **)((long)pvVar24 + 0x20);
  if (pFVar11->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar11);
    pFVar11->_oneof_case_[0] = 5;
    uVar5 = (pFVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pAVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar27);
    (pFVar11->Type_).multiarraytype_ = pAVar12;
  }
  ((pFVar11->Type_).multiarraytype_)->datatype_ = 0x20020;
  if (spec->description_ == (ModelDescription *)0x0) {
    uVar5 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pMVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar27);
    spec->description_ = pMVar10;
  }
  pMVar10 = spec->description_;
  pRVar6 = (pMVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_0020392b:
    pFVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar10->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar24 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar10->output_).super_RepeatedPtrFieldBase,pFVar15);
  }
  else {
    iVar26 = (pMVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar26) goto LAB_0020392b;
    (pMVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar26 + 1;
    pvVar24 = pRVar6->elements[iVar26];
  }
  puVar25 = (undefined8 *)(*(ulong *)((long)pvVar24 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar24 + 8) & 1) != 0) {
    puVar25 = (undefined8 *)*puVar25;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar24 + 0x10),"features",puVar25);
  if (*(long *)((long)pvVar24 + 0x20) == 0) {
    pAVar27 = (Arena *)(*(ulong *)((long)pvVar24 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar24 + 8) & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                        (pAVar27);
    *(FeatureType **)((long)pvVar24 + 0x20) = pFVar11;
  }
  pFVar11 = *(FeatureType **)((long)pvVar24 + 0x20);
  if (pFVar11->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar11);
    pFVar11->_oneof_case_[0] = 3;
    uVar5 = (pFVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pSVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringFeatureType>
                        (pAVar27);
    (pFVar11->Type_).stringtype_ = pSVar14;
  }
  if (spec->description_ == (ModelDescription *)0x0) {
    uVar5 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pMVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar27);
    spec->description_ = pMVar10;
  }
  pMVar10 = spec->description_;
  pRVar6 = (pMVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_00203a16:
    pFVar15 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar10->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar24 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar10->output_).super_RepeatedPtrFieldBase,pFVar15);
  }
  else {
    iVar26 = (pMVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar26) goto LAB_00203a16;
    (pMVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar26 + 1;
    pvVar24 = pRVar6->elements[iVar26];
  }
  puVar25 = (undefined8 *)(*(ulong *)((long)pvVar24 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar24 + 8) & 1) != 0) {
    puVar25 = (undefined8 *)*puVar25;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar24 + 0x10),"probs",puVar25);
  if (*(long *)((long)pvVar24 + 0x20) == 0) {
    pAVar27 = (Arena *)(*(ulong *)((long)pvVar24 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar24 + 8) & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                        (pAVar27);
    *(FeatureType **)((long)pvVar24 + 0x20) = pFVar11;
  }
  pFVar11 = *(FeatureType **)((long)pvVar24 + 0x20);
  if (pFVar11->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar11);
    pFVar11->_oneof_case_[0] = 6;
    uVar5 = (pFVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pDVar16 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::DictionaryFeatureType>(pAVar27);
    (pFVar11->Type_).dictionarytype_ = pDVar16;
  }
  if (*(long *)((long)pvVar24 + 0x20) == 0) {
    pAVar27 = (Arena *)(*(ulong *)((long)pvVar24 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar24 + 8) & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                        (pAVar27);
    *(FeatureType **)((long)pvVar24 + 0x20) = pFVar11;
  }
  pFVar11 = *(FeatureType **)((long)pvVar24 + 0x20);
  if (pFVar11->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar11);
    pFVar11->_oneof_case_[0] = 6;
    uVar5 = (pFVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pDVar16 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::DictionaryFeatureType>(pAVar27);
    (pFVar11->Type_).dictionarytype_ = pDVar16;
  }
  pDVar16 = (pFVar11->Type_).dictionarytype_;
  if (pDVar16->_oneof_case_[0] != 2) {
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(pDVar16);
    pDVar16->_oneof_case_[0] = 2;
    uVar5 = (pDVar16->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pSVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringFeatureType>
                        (pAVar27);
    (pDVar16->KeyType_).stringkeytype_ = pSVar14;
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"features","");
  if (spec->description_ == (ModelDescription *)0x0) {
    uVar5 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pMVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar27);
    spec->description_ = pMVar10;
  }
  uVar5 = (spec->description_->super_MessageLite)._internal_metadata_.ptr_;
  puVar25 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar25 = (undefined8 *)*puVar25;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&spec->description_->predictedfeaturename_,local_70,puVar25);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"probs","");
  if (spec->description_ == (ModelDescription *)0x0) {
    uVar5 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pMVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                        (pAVar27);
    spec->description_ = pMVar10;
  }
  uVar5 = (spec->description_->super_MessageLite)._internal_metadata_.ptr_;
  puVar25 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar25 = (undefined8 *)*puVar25;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&spec->description_->predictedprobabilitiesname_,local_50,puVar25);
  if (spec->_oneof_case_[0] != 0x193) {
    CoreML::Specification::Model::clear_Type(spec);
    spec->_oneof_case_[0] = 0x193;
    uVar5 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pNVar17 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::NeuralNetworkClassifier>(pAVar27);
    (spec->Type_).neuralnetworkclassifier_ = pNVar17;
  }
  pNVar17 = (spec->Type_).neuralnetworkclassifier_;
  if (pNVar17->_oneof_case_[0] != 100) {
    CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels(pNVar17);
    pNVar17->_oneof_case_[0] = 100;
    uVar5 = (pNVar17->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pSVar18 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                        (pAVar27);
    (pNVar17->ClassLabels_).stringclasslabels_ = pSVar18;
  }
  pSVar18 = (pNVar17->ClassLabels_).stringclasslabels_;
  pRVar6 = (pSVar18->vector_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_00203cbd:
    pbVar23 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pSVar18->vector_).super_RepeatedPtrFieldBase.arena_);
    pvVar24 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pSVar18->vector_).super_RepeatedPtrFieldBase,pbVar23);
  }
  else {
    iVar26 = (pSVar18->vector_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar26) goto LAB_00203cbd;
    (pSVar18->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar26 + 1;
    pvVar24 = pRVar6->elements[iVar26];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar24,0,*(char **)((long)pvVar24 + 8),0x3b8733);
  this = &pNVar17->layers_;
  pRVar6 = (pNVar17->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_00203d13:
    pNVar22 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pNVar22 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this->super_RepeatedPtrFieldBase,pNVar22);
  }
  else {
    iVar26 = (pNVar17->layers_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar26) goto LAB_00203d13;
    (pNVar17->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar26 + 1;
    pNVar22 = (NeuralNetworkLayer *)pRVar6->elements[iVar26];
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar22,inputName);
  pRVar6 = (pNVar22->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_00203d54:
    pbVar23 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar22->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar24 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar22->output_).super_RepeatedPtrFieldBase,pbVar23);
  }
  else {
    iVar26 = (pNVar22->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar26) goto LAB_00203d54;
    (pNVar22->output_).super_RepeatedPtrFieldBase.current_size_ = iVar26 + 1;
    pvVar24 = pRVar6->elements[iVar26];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar24,0,*(char **)((long)pvVar24 + 8),0x3b871d);
  if (pNVar22->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar22);
    pNVar22->_oneof_case_[0] = 0x8c;
    uVar5 = (pNVar22->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pIVar19 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>(pAVar27);
    (pNVar22->layer_).innerproduct_ = pIVar19;
  }
  pCVar7 = (pNVar22->layer_).convolution_;
  *(undefined1 *)&(pCVar7->stride_).arena_or_elements_ = 0;
  *(undefined8 *)&pCVar7->_kernelsize_cached_byte_size_ = 3;
  (pCVar7->stride_).current_size_ = 3;
  (pCVar7->stride_).total_size_ = 0;
  iVar26 = 9;
  do {
    lVar8._0_4_ = (pCVar7->kernelsize_).current_size_;
    lVar8._4_4_ = (pCVar7->kernelsize_).total_size_;
    if (lVar8 == 0) {
      uVar5 = (pCVar7->super_MessageLite)._internal_metadata_.ptr_;
      pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar27 = *(Arena **)pAVar27;
      }
      pWVar20 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar27);
      *(WeightParams **)&pCVar7->kernelsize_ = pWVar20;
    }
    lVar8 = *(long *)&pCVar7->kernelsize_;
    pRVar2 = (RepeatedField<float> *)(lVar8 + 0x10);
    uVar3 = *(uint *)(lVar8 + 0x10);
    if (uVar3 == *(uint *)(lVar8 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar2,*(uint *)(lVar8 + 0x14) + 1);
    }
    pfVar21 = google::protobuf::RepeatedField<float>::elements(pRVar2);
    pfVar21[uVar3] = 1.0;
    pRVar2->current_size_ = uVar3 + 1;
    iVar26 = iVar26 + -1;
  } while (iVar26 != 0);
  pRVar6 = (pNVar17->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 == (Rep *)0x0) {
LAB_00203e65:
    pNVar22 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pNVar22 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this->super_RepeatedPtrFieldBase,pNVar22);
  }
  else {
    iVar26 = (pNVar17->layers_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar6->allocated_size <= iVar26) goto LAB_00203e65;
    (pNVar17->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar26 + 1;
    pNVar22 = (NeuralNetworkLayer *)pRVar6->elements[iVar26];
  }
  pRVar6 = (pNVar22->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar6 != (Rep *)0x0) {
    iVar26 = (pNVar22->input_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar26 < pRVar6->allocated_size) {
      (pNVar22->input_).super_RepeatedPtrFieldBase.current_size_ = iVar26 + 1;
      pvVar24 = pRVar6->elements[iVar26];
      goto LAB_00203eb9;
    }
  }
  pbVar23 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar22->input_).super_RepeatedPtrFieldBase.arena_);
  pvVar24 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar22->input_).super_RepeatedPtrFieldBase,pbVar23);
LAB_00203eb9:
  std::__cxx11::string::_M_replace((ulong)pvVar24,0,*(char **)((long)pvVar24 + 8),0x3b871d);
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar22,outputName);
  if (pNVar22->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar22);
    pNVar22->_oneof_case_[0] = 0x8c;
    uVar5 = (pNVar22->super_MessageLite)._internal_metadata_.ptr_;
    pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar27 = *(Arena **)pAVar27;
    }
    pIVar19 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>(pAVar27);
    (pNVar22->layer_).innerproduct_ = pIVar19;
  }
  pCVar7 = (pNVar22->layer_).convolution_;
  *(undefined1 *)&(pCVar7->stride_).arena_or_elements_ = 0;
  *(undefined8 *)&pCVar7->_kernelsize_cached_byte_size_ = 3;
  (pCVar7->stride_).current_size_ = 3;
  (pCVar7->stride_).total_size_ = 0;
  iVar26 = 9;
  do {
    lVar9._0_4_ = (pCVar7->kernelsize_).current_size_;
    lVar9._4_4_ = (pCVar7->kernelsize_).total_size_;
    if (lVar9 == 0) {
      uVar5 = (pCVar7->super_MessageLite)._internal_metadata_.ptr_;
      pAVar27 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar27 = *(Arena **)pAVar27;
      }
      pWVar20 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar27);
      *(WeightParams **)&pCVar7->kernelsize_ = pWVar20;
    }
    lVar8 = *(long *)&pCVar7->kernelsize_;
    pRVar2 = (RepeatedField<float> *)(lVar8 + 0x10);
    uVar3 = *(uint *)(lVar8 + 0x10);
    if (uVar3 == *(uint *)(lVar8 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar2,*(uint *)(lVar8 + 0x14) + 1);
    }
    pfVar21 = google::protobuf::RepeatedField<float>::elements(pRVar2);
    pfVar21[uVar3] = 1.0;
    pRVar2->current_size_ = uVar3 + 1;
    iVar26 = iVar26 + -1;
  } while (iVar26 != 0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

void createSimpleNeuralNetworkClassifierModel(Specification::Model *spec, const char *inputName, const char *outputName) {
    
    spec->set_specificationversion(MLMODEL_SPECIFICATION_VERSION);

    auto *topIn = spec->mutable_description()->add_input();
    topIn->set_name(inputName);
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    topIn->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_INT32);

    auto *out = spec->mutable_description()->add_output();
    out->set_name(outputName);
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(3);
    out->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_INT32);

    auto *out2 = spec->mutable_description()->add_output();
    out2->set_name("features");
    out2->mutable_type()->mutable_stringtype();

    auto *out3 = spec->mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_dictionarytype();
    out3->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    std::string featureName = "features";
    spec->mutable_description()->set_predictedfeaturename(featureName);
    std::string probsName = "probs";
    spec->mutable_description()->set_predictedprobabilitiesname(probsName);

    const auto nn = spec->mutable_neuralnetworkclassifier();
    auto labels = nn->mutable_stringclasslabels();
    labels->add_vector("label1");

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input(inputName);
    innerProductLayer->add_output("middle");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_hasbias(false);
    innerProductParams->set_inputchannels(3);
    innerProductParams->set_outputchannels(3);
    for (int i = 0; i < 9; i++) {
        innerProductParams->mutable_weights()->add_floatvalue(1.0);
    }

    Specification::NeuralNetworkLayer *innerProductLayer2 = nn->add_layers();
    innerProductLayer2->add_input("middle");
    innerProductLayer2->add_output(outputName);
    Specification::InnerProductLayerParams *innerProductParams2 = innerProductLayer2->mutable_innerproduct();
    innerProductParams2->set_hasbias(false);
    innerProductParams2->set_inputchannels(3);
    innerProductParams2->set_outputchannels(3);
    for (int i = 0; i < 9; i++) {
        innerProductParams2->mutable_weights()->add_floatvalue(1.0);
    }
}